

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTChannel.cpp
# Opt level: O0

void __thiscall
LTOnlineChannel::DebugLogRaw(LTOnlineChannel *this,char *data,long httpCode,bool bHeader)

{
  bool bVar1;
  byte bVar2;
  logLevelTy lVar3;
  ulong uVar4;
  undefined8 uVar5;
  long lVar6;
  ostream *poVar7;
  char *pcVar8;
  string *psVar9;
  byte in_CL;
  long in_RDX;
  LTChannel *in_RDI;
  double dVar10;
  double now;
  size_type pos;
  string dupData;
  char sErr [100];
  string sFileName;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_fffffffffffffde8;
  lock_guard<std::mutex> *in_stack_fffffffffffffdf0;
  DataRefs *in_stack_fffffffffffffdf8;
  string *in_stack_fffffffffffffe08;
  allocator<char> *in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  string *in_stack_fffffffffffffe50;
  string local_168 [28];
  int in_stack_fffffffffffffeb4;
  double in_stack_fffffffffffffeb8;
  undefined1 local_e8 [111];
  allocator<char> local_79;
  string local_78 [32];
  string local_58 [63];
  byte local_19;
  long local_18;
  
  local_19 = in_CL & 1;
  local_18 = in_RDX;
  bVar1 = DataRefs::GetDebugLogRawFD(&dataRefs);
  if (!bVar1) {
    uVar4 = std::ofstream::is_open();
    if ((uVar4 & 1) == 0) {
      return;
    }
    std::ofstream::close();
    lVar3 = DataRefs::GetLogLevel(&dataRefs);
    if ((int)lVar3 < 3) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTChannel.cpp"
             ,0x282,"DebugLogRaw",logWARN,"DEBUG Stopped logging raw flight data to %s",
             "LTRawFD.log");
    }
    CreateMsgWindow(8.0,logWARN,"DEBUG Stopped logging raw flight data to %s","LTRawFD.log");
    return;
  }
  std::lock_guard<std::mutex>::lock_guard(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  bVar2 = std::ofstream::is_open();
  if ((bVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    LTCalcFullPath(in_stack_fffffffffffffe08);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator(&local_79);
    std::operator|(_S_out,_S_app);
    std::ofstream::open((string *)&outRaw,(_Ios_Openmode)local_58);
    bVar2 = std::ios::operator!((ios *)((long)&outRaw + *(long *)(outRaw + -0x18)));
    if ((bVar2 & 1) == 0) {
      lVar3 = DataRefs::GetLogLevel(&dataRefs);
      if ((int)lVar3 < 3) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTChannel.cpp"
               ,0x29d,"DebugLogRaw",logWARN,"DEBUG Starting to log raw flight data to %s",
               "LTRawFD.log");
      }
      CreateMsgWindow(8.0,logWARN,"DEBUG Starting to log raw flight data to %s","LTRawFD.log");
      bVar1 = false;
    }
    else {
      __errno_location();
      strerror_s((char *)in_stack_fffffffffffffdf0,(size_t)in_stack_fffffffffffffde8,0);
      lVar3 = DataRefs::GetLogLevel(&dataRefs);
      if ((int)lVar3 < 4) {
        uVar5 = std::__cxx11::string::c_str();
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTChannel.cpp"
               ,0x299,"DebugLogRaw",logERR,"DEBUG Could not open output file %s: %s",uVar5,local_e8)
        ;
      }
      uVar5 = std::__cxx11::string::c_str();
      CreateMsgWindow(12.0,logERR,"DEBUG Could not open output file %s: %s",uVar5,local_e8);
      DataRefs::SetDebugLogRawFD(&dataRefs,false);
      bVar1 = true;
    }
    std::__cxx11::string::~string(local_58);
    if (bVar1) goto LAB_001c64b7;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffeef);
  lVar6 = std::__cxx11::string::find(&stack0xfffffffffffffef0,0x38b77d);
  if ((lVar6 != -1) && (uVar4 = std::__cxx11::string::size(), lVar6 + 0x3cU <= uVar4)) {
    std::__cxx11::string::replace((ulong)&stack0xfffffffffffffef0,lVar6 + 0x12,(char *)0x28);
  }
  lVar6 = std::__cxx11::string::find(&stack0xfffffffffffffef0,0x38b78e);
  if (lVar6 != -1) {
    std::__cxx11::string::erase((ulong)&stack0xfffffffffffffef0,lVar6 + 0xc);
    std::__cxx11::string::operator+=((string *)&stack0xfffffffffffffef0,"...(truncated)...");
  }
  lVar6 = std::__cxx11::string::find(&stack0xfffffffffffffef0,0x38b7ac);
  if (lVar6 != -1) {
    std::__cxx11::string::erase((ulong)&stack0xfffffffffffffef0,lVar6 + 0x1a);
    std::__cxx11::string::operator+=((string *)&stack0xfffffffffffffef0,"...(truncated)...");
  }
  dVar10 = GetSysTime();
  std::ios_base::precision((ios_base *)((long)&outRaw + *(long *)(outRaw + -0x18)),2);
  if ((local_19 & 1) != 0) {
    if (local_18 == -1) {
      std::operator<<((ostream *)&outRaw,"\n");
    }
    in_stack_fffffffffffffe50 = (string *)std::ostream::operator<<(&outRaw,std::fixed);
    poVar7 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffe50,dVar10);
    poVar7 = std::operator<<(poVar7,' ');
    ts2string_abi_cxx11_(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4);
    poVar7 = std::operator<<(poVar7,(string *)&stack0xfffffffffffffeb8);
    poVar7 = std::operator<<(poVar7," - SimTime ");
    DataRefs::GetSimTimeString_abi_cxx11_(in_stack_fffffffffffffdf8);
    poVar7 = std::operator<<(poVar7,local_168);
    poVar7 = std::operator<<(poVar7," - ");
    pcVar8 = LTChannel::ChName(in_RDI);
    std::operator<<(poVar7,pcVar8);
    std::__cxx11::string::~string(local_168);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb8);
    if (local_18 == -1) {
      std::operator<<((ostream *)&outRaw," SENDING:\n");
    }
    else if (local_18 == -2) {
      std::operator<<((ostream *)&outRaw," RECEIVED UDP:\n");
    }
    else if (local_18 == 200) {
      std::operator<<((ostream *)&outRaw," RECEIVED HTTP_OK:\n");
    }
    else if (local_18 == 0x194) {
      std::operator<<((ostream *)&outRaw," RECEIVED HTTP_NOT_FOUND (404):\n");
    }
    else {
      poVar7 = std::operator<<((ostream *)&outRaw," RECEIVED HTTP ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_18);
      std::operator<<(poVar7,":\n");
    }
  }
  psVar9 = str_replPers(in_stack_fffffffffffffe50);
  poVar7 = std::operator<<((ostream *)&outRaw,(string *)psVar9);
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffef0);
LAB_001c64b7:
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1c64c4);
  return;
}

Assistant:

void LTOnlineChannel::DebugLogRaw(const char *data, long httpCode, bool bHeader)
{
    // no logging? return (after closing the file if open)
    if (!dataRefs.GetDebugLogRawFD()) {
        if (outRaw.is_open()) {
            outRaw.close();
            SHOW_MSG(logWARN, DBG_RAW_FD_STOP, PATH_DEBUG_RAW_FD);
        }
        return;
    }
    
    // *** Logging enabled ***
    
    // As there are different threads (e.g. in LTRealTraffic), which send data,
    // we guard file writing with a lock, so that no line gets intermingled
    // with another thread's data:
    static std::mutex logRawMutex;
    std::lock_guard<std::mutex> lock(logRawMutex);
    
    // Need to open the file first?
    if (!outRaw.is_open()) {
        // open the file, append to it
        std::string sFileName (LTCalcFullPath(PATH_DEBUG_RAW_FD));
        outRaw.open (sFileName, std::ios_base::out | std::ios_base::app);
        if (!outRaw) {
            char sErr[SERR_LEN];
            strerror_s(sErr, sizeof(sErr), errno);
            // could not open output file: bail out, decativate logging
            SHOW_MSG(logERR, DBG_RAW_FD_ERR_OPEN_OUT,
                     sFileName.c_str(), sErr);
            dataRefs.SetDebugLogRawFD(false);
            return;
        }
        SHOW_MSG(logWARN, DBG_RAW_FD_START, PATH_DEBUG_RAW_FD);
    }
    
    // Receives modifiable copy of the data
    std::string dupData (data);
    
    // Overwrite client_secret
    // {"grant_type": "password","client_id": 1,"client_secret": "7HTOw2421WBZxrGCksPvez2BG6Yl918uUHAcEWRg","username":
    std::string::size_type pos = dupData.find("\"client_secret\":");
    if (pos != std::string::npos && dupData.size() >= pos + 60)
        dupData.replace(pos+18, 40, "...");
    
    // limit output in case a password or token is found
    pos = dupData.find("\"password\":");
    if (pos != std::string::npos) {
        // just truncate after the password tag so the actual password is gone
        dupData.erase(pos + 12);
        dupData += "...(truncated)...";
    }
    
    pos = dupData.find("\"access_token\":");
    if (pos != std::string::npos) {
        dupData.erase(pos + 26);
        dupData += "...(truncated)...";
    }
    
    // timestamp (numerical and human readable)
    const double now = GetSysTime();
    outRaw.precision(2);
    if (bHeader) {
        
        // Empty line before a (new) SENDING request
        if (httpCode == HTTP_FLAG_SENDING)
            outRaw << "\n";

        // Actual header
        outRaw
        << std::fixed << now << ' ' << ts2string(now,2)
        << " - SimTime "
        << dataRefs.GetSimTimeString()
        << " - "
        // Channel's name
        << ChName();

        if (httpCode == HTTP_FLAG_SENDING)
            outRaw << " SENDING:\n";
        else if (httpCode == HTTP_FLAG_UDP)
            outRaw << " RECEIVED UDP:\n";
        else if (httpCode == HTTP_OK)
            outRaw << " RECEIVED HTTP_OK:\n";
        else if (httpCode == HTTP_NOT_FOUND)
            outRaw << " RECEIVED HTTP_NOT_FOUND (404):\n";
        else
            outRaw << " RECEIVED HTTP " << httpCode << ":\n";
    }
    // Output the actual text
    outRaw
    // the actual given data, stripped from general personal data
    << str_replPers(dupData)
    // newlines + flush
    << std::endl;
}